

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_genc.cpp
# Opt level: O1

void writeObjectCode(char *filename,char *destdir,char *optEntryPoint,char *optMatchArch,
                    char *optFilename,char *outFilePath)

{
  byte bVar1;
  FILE *__stream;
  char cVar2;
  char cVar3;
  uchar uVar4;
  UBool UVar5;
  int32_t iVar6;
  int iVar7;
  File *pFVar8;
  size_t sVar9;
  File *pFVar10;
  File *pFVar11;
  size_t sVar12;
  char *__dest;
  FileStream *pFVar13;
  FileStream *pFVar14;
  UNewDataMemory *pData;
  uint uVar15;
  long lVar16;
  uint32_t uVar17;
  undefined8 extraout_RDX;
  Elf64_Sym *pEVar18;
  File *unaff_RBX;
  uint32_t uVar19;
  File *unaff_RBP;
  ulong uVar20;
  char cVar21;
  File *fileStream;
  Elf32_Sym *addr;
  UErrorCode *pUVar22;
  UErrorCode code;
  char *pcVar23;
  char *pcVar24;
  Elf32_Shdr *pEVar25;
  Elf32_Sym *unaff_R13;
  uint32_t uVar26;
  undefined8 unaff_R14;
  char *pcVar27;
  char entry [96];
  char buffer [4096];
  UErrorCode UStack_1144;
  FileStream *pFStack_1140;
  File *pFStack_1138;
  File *pFStack_1130;
  File *pFStack_1128;
  Elf64_Sym *pEStack_1120;
  char *pcStack_1118;
  File *pFStack_1110;
  undefined8 uStack_1108;
  char *pcStack_1100;
  File *pFStack_10f8;
  char *pcStack_10f0;
  File *pFStack_10e8;
  Elf64_Shdr *pEStack_10e0;
  Elf64_Sym *pEStack_10d8;
  File *pFStack_10d0;
  File *pFStack_10c8;
  File *pFStack_10c0;
  char local_10b7;
  Elf32_Half local_10b6;
  Elf32_Word local_10b4;
  Elf64_Sym *local_10b0;
  char *local_10a8;
  char *local_10a0;
  char local_1098 [8];
  char *pcStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  File local_1038 [128];
  
  local_1048 = 0;
  uStack_1040 = 0;
  local_1058 = 0;
  uStack_1050 = 0;
  local_1068 = 0;
  uStack_1060 = 0;
  local_1078 = 0;
  uStack_1070 = 0;
  local_1088 = 0;
  uStack_1080 = 0;
  local_1098[0] = '\0';
  local_1098[1] = '\0';
  local_1098[2] = '\0';
  local_1098[3] = '\0';
  local_1098[4] = '\0';
  local_1098[5] = '\0';
  local_1098[6] = '\0';
  local_1098[7] = '\0';
  pcStack_1090 = (char *)0x0;
  pcVar24 = optFilename;
  local_10b0 = (Elf64_Sym *)filename;
  local_10a8 = outFilePath;
  local_10a0 = optEntryPoint;
  if (optMatchArch == (char *)0x0) {
    optMatchArch = (char *)CONCAT71((int7)((ulong)unaff_R14 >> 8),1);
    unaff_RBX = (File *)CONCAT62((int6)((ulong)unaff_RBX >> 0x10),0x20);
    local_1038[0].basenameLength._2_2_ = 3;
    pcVar23 = "genccode: using architecture cpu=%hu bits=%hu big-endian=%d\n";
LAB_001ebc6d:
    unaff_R13 = (Elf32_Sym *)local_10b0;
    local_10b7 = (char)optMatchArch;
    pcVar27 = (char *)((ulong)optMatchArch & 0xff);
    pFStack_10c0 = (File *)0x1ebc8b;
    local_10b6 = local_1038[0].basenameLength._2_2_;
    printf(pcVar23,(ulong)local_1038[0].basenameLength._2_2_,(ulong)unaff_RBX & 0xffff);
    fileStream = (File *)0x377fc0;
    pFStack_10c0 = (File *)0x1ebc9a;
    pFVar8 = (File *)T_FileStream_open((char *)unaff_R13,"rb");
    if (pFVar8 == (File *)0x0) {
      pFStack_10c0 = (File *)0x1ebf36;
      writeObjectCode_cold_8();
      pFVar11 = (File *)optFilename;
LAB_001ebf36:
      pFVar10 = pFVar11;
      pFStack_10c0 = (File *)0x1ebf43;
      writeObjectCode_cold_7();
      pEVar25 = (Elf32_Shdr *)destdir;
LAB_001ebf43:
      pFStack_10c0 = (File *)0x1ebf4d;
      writeObjectCode_cold_5();
    }
    else {
      pFStack_10c0 = (File *)0x1ebcae;
      local_10b4 = T_FileStream_size((FileStream *)pFVar8);
      pFVar11 = (File *)(local_1098 + 1);
      pcVar24 = ".o";
      pFStack_10c0 = (File *)0x1ebcd7;
      pcVar27 = (char *)pFVar11;
      outFilePath = optFilename;
      getOutFilename((char *)unaff_R13,destdir,(char *)local_1038,(char *)pFVar11,".o",optFilename);
      if (local_10a8 != (char *)0x0) {
        pFStack_10c0 = (File *)0x1ebcee;
        strcpy(local_10a8,(char *)local_1038);
      }
      if (local_10a0 != (char *)0x0) {
        pFStack_10c0 = (File *)0x1ebd00;
        strcpy((char *)pFVar11,local_10a0);
        pFStack_10c0 = (File *)0x1ebd08;
        sVar9 = strlen((char *)pFVar11);
        builtin_strncpy(local_1098 + sVar9 + 1,"_dat",5);
      }
      pFStack_10c0 = (File *)0x1ebd1e;
      sVar9 = strlen((char *)pFVar11);
      if (0 < (int)(uint)sVar9) {
        pcVar27 = (char *)0x0;
        do {
          if (((undefined1 *)((long)&((File *)((long)pcVar27 + -0x10a0))->basename + 1))
              [(long)register0x00000020] == '-') {
            ((undefined1 *)((long)&((File *)((long)pcVar27 + -0x10a0))->basename + 1))
            [(long)register0x00000020] = 0x5f;
          }
          pcVar27 = (char *)((long)&((File *)pcVar27)->pathname + 1);
        } while ((File *)(ulong)((uint)sVar9 & 0x7fffffff) != (File *)pcVar27);
      }
      fileStream = (File *)0x378474;
      pFStack_10c0 = (File *)0x1ebd51;
      pFVar10 = (File *)T_FileStream_open((char *)local_1038,"wb");
      optMatchArch = (char *)pFVar8;
      if (pFVar10 == (File *)0x0) goto LAB_001ebf36;
      uVar4 = '\x02' - (local_10b7 == '\0');
      if ((short)unaff_RBX == 0x20) {
        writeObjectCode::header32.e_machine = local_10b6;
        uVar15 = writeObjectCode::sectionHeaders32[4].sh_offset & 0xf;
        pcVar27 = (char *)(ulong)uVar15;
        if (uVar15 == 0) {
          unaff_RBX = (File *)0x0;
        }
        else {
          unaff_RBX = (File *)(ulong)(0x10 - uVar15);
          writeObjectCode::sectionHeaders32[4].sh_offset =
               writeObjectCode::sectionHeaders32[4].sh_offset + (0x10 - uVar15);
        }
        writeObjectCode::sectionHeaders32[4].sh_size = local_10b4;
        pEVar25 = writeObjectCode::sectionHeaders32;
        writeObjectCode::symbols32[1].st_size = local_10b4;
        unaff_R13 = writeObjectCode::symbols32;
        pFStack_10c0 = (File *)0x1ebe03;
        writeObjectCode::header32.e_ident[5] = uVar4;
        T_FileStream_write((FileStream *)pFVar10,&writeObjectCode::header32,0x34);
        pFStack_10c0 = (File *)0x1ebe13;
        T_FileStream_write((FileStream *)pFVar10,writeObjectCode::sectionHeaders32,200);
        addr = writeObjectCode::symbols32;
        iVar6 = 0x20;
      }
      else {
        writeObjectCode::header64.e_machine = local_10b6;
        uVar15 = (uint)writeObjectCode::sectionHeaders64[4].sh_offset & 0xf;
        pcVar27 = (char *)(ulong)uVar15;
        if ((writeObjectCode::sectionHeaders64[4].sh_offset & 0xf) == 0) {
          unaff_RBX = (File *)0x0;
        }
        else {
          unaff_RBX = (File *)(ulong)(0x10 - uVar15);
          writeObjectCode::sectionHeaders64[4].sh_offset =
               (long)&unaff_RBX->pathname + writeObjectCode::sectionHeaders64[4].sh_offset;
        }
        writeObjectCode::sectionHeaders64[4].sh_size = (Elf64_Xword)(int)local_10b4;
        pFStack_10c0 = (File *)0x1ebe57;
        writeObjectCode::header64.e_ident[5] = uVar4;
        writeObjectCode::symbols64[1].st_size = writeObjectCode::sectionHeaders64[4].sh_size;
        T_FileStream_write((FileStream *)pFVar10,&writeObjectCode::header64,0x40);
        pFStack_10c0 = (File *)0x1ebe67;
        T_FileStream_write((FileStream *)pFVar10,writeObjectCode::sectionHeaders64,0x140);
        iVar6 = 0x30;
        addr = (Elf32_Sym *)writeObjectCode::symbols64;
        pEVar25 = (Elf32_Shdr *)writeObjectCode::sectionHeaders64;
        unaff_R13 = (Elf32_Sym *)writeObjectCode::symbols64;
      }
      pFStack_10c0 = (File *)0x1ebe77;
      T_FileStream_write((FileStream *)pFVar10,addr,iVar6);
      pFStack_10c0 = (File *)0x1ebe8b;
      T_FileStream_write((FileStream *)pFVar10,"",0x28);
      pFStack_10c0 = (File *)0x1ebe9d;
      T_FileStream_write((FileStream *)pFVar10,local_1098,0x60);
      if ((int)unaff_RBX != 0) {
        pFStack_10c0 = (File *)0x1ebeb2;
        T_FileStream_write((FileStream *)pFVar10,"",(int)unaff_RBX);
      }
      fileStream = local_1038;
      pFStack_10c0 = (File *)0x1ebec7;
      iVar6 = T_FileStream_read((FileStream *)pFVar8,fileStream,0x1000);
      if (iVar6 != 0) {
        unaff_RBX = local_1038;
        do {
          pFStack_10c0 = (File *)0x1ebee0;
          T_FileStream_write((FileStream *)pFVar10,unaff_RBX,iVar6);
          pFStack_10c0 = (File *)0x1ebef0;
          fileStream = unaff_RBX;
          iVar6 = T_FileStream_read((FileStream *)pFVar8,unaff_RBX,0x1000);
        } while (iVar6 != 0);
      }
      pFStack_10c0 = (File *)0x1ebefc;
      iVar7 = T_FileStream_error((FileStream *)pFVar8);
      if (iVar7 != 0) goto LAB_001ebf43;
      pFStack_10c0 = (File *)0x1ebf08;
      iVar7 = T_FileStream_error((FileStream *)pFVar10);
      if (iVar7 == 0) {
        pFStack_10c0 = (File *)0x1ebf14;
        T_FileStream_close((FileStream *)pFVar10);
        pFStack_10c0 = (File *)0x1ebf1c;
        T_FileStream_close((FileStream *)pFVar8);
        return;
      }
    }
    pFStack_10c0 = (File *)0x1ebf57;
    writeObjectCode_cold_6();
    unaff_RBP = (File *)optFilename;
    destdir = (char *)pEVar25;
LAB_001ebf57:
    pFVar8 = unaff_RBP;
    pFStack_10c0 = (File *)0x1ebf5f;
    writeObjectCode_cold_4();
LAB_001ebf5f:
    pFStack_10c0 = (File *)0x1ebf67;
    writeObjectCode_cold_3();
LAB_001ebf67:
    pFStack_10c0 = (File *)0x1ebf6f;
    pFVar11 = (File *)optMatchArch;
    writeObjectCode_cold_2();
  }
  else {
    fileStream = (File *)0x377fc0;
    pFStack_10c0 = (File *)0x1ebb9c;
    pcVar27 = optMatchArch;
    pFVar8 = (File *)T_FileStream_open(optMatchArch,"rb");
    pFVar10 = (File *)optFilename;
    if (pFVar8 == (File *)0x0) goto LAB_001ebf57;
    fileStream = local_1038;
    pFStack_10c0 = (File *)0x1ebbbd;
    pFVar11 = pFVar8;
    iVar6 = T_FileStream_read((FileStream *)pFVar8,fileStream,0x800);
    if (iVar6 < 0x34) goto LAB_001ebf5f;
    if (((((char)local_1038[0].pathname != '\x7f') || (local_1038[0].pathname._1_1_ != 'E')) ||
        (local_1038[0].pathname._2_1_ != 'L')) ||
       ((local_1038[0].pathname._3_1_ != 'F' ||
        (uVar15 = CONCAT31((int3)((uint)iVar6 >> 8),local_1038[0].pathname._4_1_) - 3,
        pcVar27 = (char *)(ulong)uVar15, (byte)uVar15 < 0xfe)))) goto LAB_001ebf67;
    if (local_1038[0].pathname._5_1_ != '\x02') {
      optMatchArch = (char *)CONCAT71((int7)((ulong)optMatchArch >> 8),
                                      local_1038[0].pathname._5_1_ == '\x02');
      unaff_RBX = (File *)(ulong)((uint)(local_1038[0].pathname._4_1_ != '\x01') * 0x20 + 0x20);
      pFStack_10c0 = (File *)0x1ebc44;
      T_FileStream_close((FileStream *)pFVar8);
      pcVar23 = "genccode: --match-arch cpu=%hu bits=%hu big-endian=%d\n";
      goto LAB_001ebc6d;
    }
  }
  pFStack_10c0 = (File *)createCommonDataFile;
  writeObjectCode_cold_1();
  pcStack_1100 = pcStack_1090;
  cVar3 = local_1098[0];
  cVar2 = (char)local_10a0;
  uVar26 = (uint32_t)local_10a8;
  pEStack_1120 = local_10b0;
  UStack_1144 = U_ZERO_ERROR;
  code = 0x200;
  uStack_1108 = extraout_RDX;
  pFStack_10e8 = unaff_RBX;
  pEStack_10e0 = (Elf64_Shdr *)destdir;
  pEStack_10d8 = (Elf64_Sym *)unaff_R13;
  pFStack_10d0 = (File *)optMatchArch;
  pFStack_10c8 = pFVar10;
  pFStack_10c0 = pFVar8;
  pFStack_1130 = (File *)uprv_malloc_63(0x200);
  if (pFStack_1130 != (File *)0x0) {
    maxSize = uVar26;
    pFStack_1110 = (File *)outFilePath;
    if (pFVar11 == (File *)0x0) {
      pFVar11 = (File *)u_getDataDirectory_63();
    }
    pFVar10 = (File *)"icudt63l";
    if (fileStream != (File *)0x0) {
      pFVar10 = fileStream;
    }
    pFVar8 = (File *)0x329442;
    if ((File *)pcVar27 != (File *)0x0) {
      pFVar8 = (File *)pcVar27;
    }
    pcStack_10f0 = ".";
    if (pcVar24 != (char *)0x0) {
      pcStack_10f0 = pcVar24;
    }
    pFStack_1128 = pFVar11;
    if (pEStack_1120 != (Elf64_Sym *)0x0) {
      pFStack_1140 = T_FileStream_open((char *)pEStack_1120,"r");
      if (pFStack_1140 != (FileStream *)0x0) goto LAB_001ec06e;
      createCommonDataFile_cold_1();
    }
    pFStack_1140 = T_FileStream_stdin();
LAB_001ec06e:
    if (cVar3 != '\0') {
      pcVar24 = "generating %s_%s.c (table of contents source file)\n";
      if (cVar2 == '\0') {
        pcVar24 = "generating %s.%s (common data file with table of contents)\n";
      }
      printf(pcVar24,pFVar10,pFVar8);
    }
    pcVar27 = (char *)0x0;
    outFilePath = (char *)pFStack_1130;
    pFVar13 = pFStack_1140;
    pFStack_1138 = pFVar10;
    pFStack_10f8 = pFVar8;
LAB_001ec0b0:
    pFVar10 = pFStack_1130;
    if ((((File *)pcVar27 != (File *)0x0) &&
        (pFVar11 = (File *)pcVar27, *(char *)&((File *)pcVar27)->pathname != '\0')) ||
       (pFVar11 = (File *)T_FileStream_readLine(pFVar13,(char *)pFStack_1130,0x200),
       outFilePath = (char *)pFVar10, pFVar11 != (File *)0x0)) {
      pcVar27 = outFilePath;
      if (*(char *)&pFVar11->pathname != '\0') {
        pcVar27 = (char *)pFVar11;
        outFilePath = (char *)pFVar11;
      }
      do {
        bVar1 = *(byte *)&((File *)pcVar27)->pathname;
        if (bVar1 < 0xd) {
          if (bVar1 == 0) goto LAB_001ec117;
          if (bVar1 == 10) goto LAB_001ec10a;
        }
        else {
          if (bVar1 == 0xd) goto LAB_001ec10a;
          if (bVar1 == 0x20) {
            *(char *)&((File *)pcVar27)->pathname = '\0';
            pcVar27 = (char *)((long)&((File *)pcVar27)->pathname + 1);
            goto LAB_001ec117;
          }
        }
        pcVar27 = (char *)((long)&((File *)pcVar27)->pathname + 1);
      } while( true );
    }
    uprv_free_63(pFStack_1130);
    pFVar14 = T_FileStream_stdin();
    if (pFVar13 != pFVar14) {
      T_FileStream_close(pFVar13);
    }
    fileStream = pFStack_10f8;
    outFilePath = (char *)pFStack_1138;
    if ((ulong)fileCount == 0) {
      pEVar18 = (Elf64_Sym *)"<stdin>";
      if (pEStack_1120 != (Elf64_Sym *)0x0) {
        pEVar18 = pEStack_1120;
      }
      fprintf(_stderr,"gencmn: no files listed in %s\n",pEVar18);
      return;
    }
    qsort(files,(ulong)fileCount,0x20,compareFiles);
    pcVar27 = (char *)pFStack_1128;
    pFVar10 = files;
    if (cVar2 == '\0') {
      uVar20 = (ulong)fileCount;
      if (uVar20 != 0) {
        iVar7 = fileCount * 8 + 4;
        uVar15 = basenameTotal + fileCount * 8 + 0x13 & 0xfffffff0;
        lVar16 = 0;
        do {
          *(uint *)((long)&pFVar10->fileOffset + lVar16) = uVar15;
          uVar15 = uVar15 + (*(int *)((long)&pFVar10->fileSize + lVar16) + 0xfU & 0xfffffff0);
          *(int *)((long)&pFVar10->basenameOffset + lVar16) = iVar7;
          iVar7 = iVar7 + *(int *)((long)&pFVar10->basenameLength + lVar16);
          lVar16 = lVar16 + 0x20;
        } while (uVar20 << 5 != lVar16);
      }
      pFVar10 = (File *)
                " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
      ;
      if (pFStack_1110 != (File *)0x0) {
        pFVar10 = pFStack_1110;
      }
      pData = udata_create((char *)pFStack_1128,(char *)fileStream,outFilePath,&dataInfo,
                           (char *)pFVar10,&UStack_1144);
      code = UStack_1144;
      if (U_ZERO_ERROR < UStack_1144) goto LAB_001ec983;
      udata_write32(pData,fileCount);
      if (fileCount != 0) {
        lVar16 = 0;
        uVar20 = 0;
        do {
          udata_write32(pData,*(uint32_t *)((long)&files->basenameOffset + lVar16));
          udata_write32(pData,*(uint32_t *)((long)&files->fileOffset + lVar16));
          uVar20 = uVar20 + 1;
          lVar16 = lVar16 + 0x20;
        } while (uVar20 < fileCount);
      }
      if (fileCount != 0) {
        lVar16 = 0x10;
        uVar20 = 0;
        do {
          udata_writeString(pData,*(char **)((long)files + lVar16 + -8),
                            *(int32_t *)((long)&files->pathname + lVar16));
          uVar20 = uVar20 + 1;
          lVar16 = lVar16 + 0x20;
        } while (uVar20 < fileCount);
      }
      uVar17 = basenameTotal + fileCount * 8 + 4;
      if (fileCount == 0) {
LAB_001ec8d3:
        if ((uVar17 & 0xf) != 0) {
          udata_writePadding(pData,0x10 - (uVar17 & 0xf));
        }
        udata_finish(pData,&UStack_1144);
        uVar20 = (ulong)(uint)UStack_1144;
        if (U_ZERO_ERROR < UStack_1144) {
          pUVar22 = &UStack_1144;
          createCommonDataFile_cold_9();
          strcmp(*(char **)(uVar20 + 8),*(char **)(pUVar22 + 2));
          return;
        }
        return;
      }
      pcVar27 = createCommonDataFile::buffer;
      outFilePath = (char *)0x0;
      pFVar10 = fileStream;
      while( true ) {
        if ((uVar17 & 0xf) != 0) {
          udata_writePadding(pData,0x10 - (uVar17 & 0xf));
        }
        if (cVar3 != '\0') {
          pcVar24 = "s";
          if ((ulong)files[(long)outFilePath].fileSize == 1) {
            pcVar24 = "";
          }
          printf("adding %s (%ld byte%s)\n",files[(long)outFilePath].pathname,
                 (ulong)files[(long)outFilePath].fileSize,pcVar24);
        }
        uVar26 = (int)outFilePath * 0x20;
        fileStream = (File *)T_FileStream_open(files[(long)outFilePath].pathname,"rb");
        pFVar8 = (File *)outFilePath;
        if (fileStream == (File *)0x0) goto LAB_001ec967;
        iVar7 = T_FileStream_read((FileStream *)fileStream,createCommonDataFile::buffer,0x1000);
        uVar19 = 0;
        while (iVar7 != 0) {
          uVar19 = uVar19 + iVar7;
          udata_writeBlock(pData,createCommonDataFile::buffer,iVar7);
          iVar7 = T_FileStream_read((FileStream *)fileStream,createCommonDataFile::buffer,0x1000);
        }
        T_FileStream_close((FileStream *)fileStream);
        uVar17 = files[(long)outFilePath].fileSize;
        pFVar10 = files;
        if (uVar19 != uVar17) break;
        uVar15 = (int)outFilePath + 1;
        outFilePath = (char *)(ulong)uVar15;
        pFVar10 = fileStream;
        if (fileCount <= uVar15) goto LAB_001ec8d3;
      }
      goto LAB_001ec96f;
    }
    strcpy(createCommonDataFile::buffer,(char *)pFStack_1128);
    sVar9 = strlen(createCommonDataFile::buffer);
    pcVar24 = createCommonDataFile::buffer + sVar9;
    if ((0 < (long)sVar9) && ((&DAT_0040814f)[sVar9] != '/')) {
      *pcVar24 = '/';
      pcVar24 = createCommonDataFile::buffer + sVar9 + 1;
    }
    strcpy(pcVar24,outFilePath);
    if (*(char *)&fileStream->pathname != '\0') {
      sVar9 = strlen(pcVar24);
      pcVar23 = pcVar24 + sVar9;
      pcVar24 = pcVar23 + 1;
      *pcVar23 = '_';
      strcpy(pcVar24,(char *)fileStream);
    }
    sVar9 = strlen(pcVar24);
    (pcVar24 + sVar9)[0] = '.';
    (pcVar24 + sVar9)[1] = 'c';
    pcVar24[sVar9 + 2] = '\0';
    pFVar13 = T_FileStream_open(createCommonDataFile::buffer,"w");
    pcVar24 = pcStack_1100;
    if (pcStack_1100 != (char *)0x0) {
      strcpy(pcStack_1100,createCommonDataFile::buffer);
    }
    code = (UErrorCode)pcVar24;
    pcVar27 = (char *)pFVar11;
    if (pFVar13 != (FileStream *)0x0) {
      sprintf(createCommonDataFile::buffer,
              "/*\n * ICU common data table of contents for %s.%s\n * Automatically generated by icu/source/tools/gencmn/gencmn .\n */\n\n#include \"unicode/utypes.h\"\n#include \"unicode/udata.h\"\n\n/* external symbol declarations for data (%d files) */\n"
              ,outFilePath,fileStream,(ulong)fileCount);
      T_FileStream_writeLine(pFVar13,createCommonDataFile::buffer);
      sprintf(createCommonDataFile::buffer,"extern const char\n    %s%s[]","",files->pathname);
      T_FileStream_writeLine(pFVar13,createCommonDataFile::buffer);
      if (1 < fileCount) {
        uVar20 = 1;
        lVar16 = 0x20;
        do {
          sprintf(createCommonDataFile::buffer,",\n    %s%s[]","",
                  *(undefined8 *)((long)&files->pathname + lVar16));
          T_FileStream_writeLine(pFVar13,createCommonDataFile::buffer);
          uVar20 = uVar20 + 1;
          lVar16 = lVar16 + 0x20;
        } while (uVar20 < fileCount);
      }
      T_FileStream_writeLine(pFVar13,";\n\n");
      sprintf(createCommonDataFile::buffer,
              "U_EXPORT struct {\n    uint16_t headerSize;\n    uint8_t magic1, magic2;\n    UDataInfo info;\n    char padding[%lu];\n    uint32_t count, reserved;\n    struct {\n        const char *name;\n        const void *data;\n    } toc[%lu];\n} U_EXPORT2 %s_dat = {\n    32, 0xda, 0x27, {\n        %lu, 0,\n        %u, %u, %u, 0,\n        {0x54, 0x6f, 0x43, 0x50},\n        {1, 0, 0, 0},\n        {0, 0, 0, 0}\n    },\n    \"\", %lu, 0, {\n"
              ,8,(ulong)fileCount,uStack_1108,0x14,0,0,2,(ulong)fileCount);
      T_FileStream_writeLine(pFVar13,createCommonDataFile::buffer);
      sprintf(createCommonDataFile::buffer,"        { \"%s\", %s%s }",files->basename,"",
              files->pathname);
      T_FileStream_writeLine(pFVar13,createCommonDataFile::buffer);
      if (1 < fileCount) {
        uVar20 = 1;
        lVar16 = 0x28;
        do {
          sprintf(createCommonDataFile::buffer,",\n        { \"%s\", %s%s }",
                  *(undefined8 *)((long)&files->pathname + lVar16),"",
                  *(undefined8 *)((long)files + lVar16 + -8));
          T_FileStream_writeLine(pFVar13,createCommonDataFile::buffer);
          uVar20 = uVar20 + 1;
          lVar16 = lVar16 + 0x20;
        } while (uVar20 < fileCount);
      }
      T_FileStream_writeLine(pFVar13,"\n    }\n};\n");
      T_FileStream_close(pFVar13);
      uprv_free_63((void *)0x0);
      return;
    }
    goto LAB_001ec97e;
  }
  goto LAB_001ec979;
LAB_001ec10a:
  *(char *)&((File *)pcVar27)->pathname = '\0';
LAB_001ec117:
  if (*(char *)&((File *)outFilePath)->pathname == '#') goto LAB_001ec0b0;
  pcVar24 = getLongPathname(outFilePath);
  if (fileCount == fileMax) {
    fileMax = fileMax + 0x100;
    files = (File *)uprv_realloc_63(files,(ulong)fileMax << 5);
    if (files != (File *)0x0) goto LAB_001ec162;
    createCommonDataFile_cold_5();
  }
  else {
LAB_001ec162:
    pcStack_1118 = pcVar24;
    if (cVar2 != '\0') {
      sVar9 = strlen(pcVar24);
      fileStream = pFStack_1138;
      sVar12 = strlen((char *)pFStack_1138);
      pFVar8 = (File *)(sVar9 + sVar12 + 1);
      uVar26 = (int)(sVar9 + sVar12) + 2;
      pcVar24 = allocString(uVar26);
      strcpy(pcVar24,(char *)fileStream);
      sVar9 = strlen(pcVar24);
      (pcVar24 + sVar9)[0] = '/';
      (pcVar24 + sVar9)[1] = '\0';
      strcat(pcVar24,pcStack_1118);
      files[fileCount].basename = pcVar24;
      pcVar23 = allocString(uVar26);
      files[fileCount].pathname = pcVar23;
      if ((int)pFVar8 != 0) {
        lVar16 = 0;
        do {
          cVar21 = '_';
          if (2 < (byte)(pcVar24[lVar16] - 0x2dU)) {
            cVar21 = pcVar24[lVar16];
          }
          pcVar23[lVar16] = cVar21;
          lVar16 = lVar16 + 1;
        } while ((int)pFVar8 != (int)lVar16);
        pcVar23 = pcVar23 + lVar16;
      }
      *pcVar23 = '\0';
LAB_001ec3c0:
      fileCount = fileCount + 1;
      pFVar13 = pFStack_1140;
      goto LAB_001ec0b0;
    }
    UVar5 = uprv_pathIsAbsolute_63(pcVar24);
    if (UVar5 == '\0') {
      sVar9 = strlen(pcVar24);
      pcVar23 = pcStack_10f0;
      sVar12 = strlen(pcStack_10f0);
      __dest = (char *)uprv_malloc_63((long)((int)sVar12 + (int)sVar9 + 2));
      strcpy(__dest,pcVar23);
      sVar9 = strlen(__dest);
      (__dest + sVar9)[0] = '/';
      (__dest + sVar9)[1] = '\0';
      sVar9 = strlen(__dest);
      __dest[(int)sVar9] = '\0';
      strcat(__dest,pcVar24);
      sVar9 = strlen(pcVar24);
      fileStream = pFStack_1138;
      sVar12 = strlen((char *)pFStack_1138);
      uVar26 = (int)sVar9 + (int)sVar12 + 2;
      pFVar8 = (File *)allocString(uVar26);
      strcpy((char *)pFVar8,(char *)fileStream);
      sVar9 = strlen((char *)pFVar8);
      *(undefined2 *)((long)&pFVar8->pathname + sVar9) = 0x2f;
      strcat((char *)pFVar8,pcStack_1118);
      pFVar10 = files;
      uVar20 = (ulong)fileCount;
      files[uVar20].basename = (char *)pFVar8;
      pFVar10[uVar20].basenameLength = uVar26;
      pFVar10[uVar20].pathname = __dest;
      basenameTotal = basenameTotal + uVar26;
      pFVar13 = T_FileStream_open(__dest,"rb");
      if (pFVar13 == (FileStream *)0x0) goto LAB_001ec95f;
      uVar15 = T_FileStream_size(pFVar13);
      fileStream = (File *)(ulong)uVar15;
      iVar7 = T_FileStream_error(pFVar13);
      if ((iVar7 != 0) || (uVar15 < 0x15)) goto LAB_001ec957;
      T_FileStream_close(pFVar13);
      pFVar13 = pFStack_1140;
      if ((maxSize != 0) && (maxSize < uVar15)) {
        if (cVar3 != '\0') {
          printf("%s ignored (size %ld > %ld)\n",__dest,(ulong)uVar15);
        }
        goto LAB_001ec0b0;
      }
      files[fileCount].fileSize = uVar15;
      goto LAB_001ec3c0;
    }
  }
  createCommonDataFile_cold_2();
LAB_001ec957:
  uVar26 = (uint32_t)pFVar13;
  createCommonDataFile_cold_3();
LAB_001ec95f:
  createCommonDataFile_cold_4();
  pFVar10 = fileStream;
LAB_001ec967:
  fileStream = pFVar10;
  createCommonDataFile_cold_8();
  pFVar10 = (File *)outFilePath;
  outFilePath = (char *)pFVar8;
LAB_001ec96f:
  code = (int)pFVar10 + uVar26;
  createCommonDataFile_cold_7();
LAB_001ec979:
  createCommonDataFile_cold_10();
LAB_001ec97e:
  createCommonDataFile_cold_6();
LAB_001ec983:
  __stream = _stderr;
  pcVar24 = u_errorName_63(code);
  fprintf(__stream,"gencmn: udata_create(-d %s -n %s -t %s) failed - %s\n",pcVar27,outFilePath,
          fileStream,pcVar24);
  exit(UStack_1144);
}

Assistant:

U_CAPI void U_EXPORT2
writeObjectCode(const char *filename, const char *destdir, const char *optEntryPoint, const char *optMatchArch, const char *optFilename, char *outFilePath) {
    /* common variables */
    char buffer[4096], entry[96]={ 0 };
    FileStream *in, *out;
    const char *newSuffix;
    int32_t i, entryLength, length, size, entryOffset=0, entryLengthOffset=0;

    uint16_t cpu, bits;
    UBool makeBigEndian;

    /* platform-specific variables and initialization code */
#ifdef U_ELF
    /* 32-bit Elf file header */
    static Elf32_Ehdr header32={
        {
            /* e_ident[] */
            ELFMAG0, ELFMAG1, ELFMAG2, ELFMAG3,
            ELFCLASS32,
            U_IS_BIG_ENDIAN ? ELFDATA2MSB : ELFDATA2LSB,
            EV_CURRENT /* EI_VERSION */
        },
        ET_REL,
        EM_386,
        EV_CURRENT, /* e_version */
        0, /* e_entry */
        0, /* e_phoff */
        (Elf32_Off)sizeof(Elf32_Ehdr), /* e_shoff */
        0, /* e_flags */
        (Elf32_Half)sizeof(Elf32_Ehdr), /* eh_size */
        0, /* e_phentsize */
        0, /* e_phnum */
        (Elf32_Half)sizeof(Elf32_Shdr), /* e_shentsize */
        5, /* e_shnum */
        2 /* e_shstrndx */
    };

    /* 32-bit Elf section header table */
    static Elf32_Shdr sectionHeaders32[5]={
        { /* SHN_UNDEF */
            0, 0, 0, 0, 0, 0, 0, 0, 0, 0
        },
        { /* .symtab */
            1, /* sh_name */
            SHT_SYMTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf32_Off)(sizeof(header32)+sizeof(sectionHeaders32)), /* sh_offset */
            (Elf32_Word)(2*sizeof(Elf32_Sym)), /* sh_size */
            3, /* sh_link=sect hdr index of .strtab */
            1, /* sh_info=One greater than the symbol table index of the last
                * local symbol (with STB_LOCAL). */
            4, /* sh_addralign */
            (Elf32_Word)(sizeof(Elf32_Sym)) /* sh_entsize */
        },
        { /* .shstrtab */
            9, /* sh_name */
            SHT_STRTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf32_Off)(sizeof(header32)+sizeof(sectionHeaders32)+2*sizeof(Elf32_Sym)), /* sh_offset */
            40, /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            1, /* sh_addralign */
            0 /* sh_entsize */
        },
        { /* .strtab */
            19, /* sh_name */
            SHT_STRTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf32_Off)(sizeof(header32)+sizeof(sectionHeaders32)+2*sizeof(Elf32_Sym)+40), /* sh_offset */
            (Elf32_Word)sizeof(entry), /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            1, /* sh_addralign */
            0 /* sh_entsize */
        },
        { /* .rodata */
            27, /* sh_name */
            SHT_PROGBITS,
            SHF_ALLOC, /* sh_flags */
            0, /* sh_addr */
            (Elf32_Off)(sizeof(header32)+sizeof(sectionHeaders32)+2*sizeof(Elf32_Sym)+40+sizeof(entry)), /* sh_offset */
            0, /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            16, /* sh_addralign */
            0 /* sh_entsize */
        }
    };

    /* symbol table */
    static Elf32_Sym symbols32[2]={
        { /* STN_UNDEF */
            0, 0, 0, 0, 0, 0
        },
        { /* data entry point */
            1, /* st_name */
            0, /* st_value */
            0, /* st_size */
            ELF64_ST_INFO(STB_GLOBAL, STT_OBJECT),
            0, /* st_other */
            4 /* st_shndx=index of related section table entry */
        }
    };

    /* section header string table, with decimal string offsets */
    static const char sectionStrings[40]=
        /*  0 */ "\0"
        /*  1 */ ".symtab\0"
        /*  9 */ ".shstrtab\0"
        /* 19 */ ".strtab\0"
        /* 27 */ ".rodata\0"
        /* 35 */ "\0\0\0\0"; /* contains terminating NUL */
        /* 40: padded to multiple of 8 bytes */

    /*
     * Use entry[] for the string table which will contain only the
     * entry point name.
     * entry[0] must be 0 (NUL)
     * The entry point name can be up to 38 characters long (sizeof(entry)-2).
     */

    /* 16-align .rodata in the .o file, just in case */
    static const char padding[16]={ 0 };
    int32_t paddingSize;

#ifdef U_ELF64
    /* 64-bit Elf file header */
    static Elf64_Ehdr header64={
        {
            /* e_ident[] */
            ELFMAG0, ELFMAG1, ELFMAG2, ELFMAG3,
            ELFCLASS64,
            U_IS_BIG_ENDIAN ? ELFDATA2MSB : ELFDATA2LSB,
            EV_CURRENT /* EI_VERSION */
        },
        ET_REL,
        EM_X86_64,
        EV_CURRENT, /* e_version */
        0, /* e_entry */
        0, /* e_phoff */
        (Elf64_Off)sizeof(Elf64_Ehdr), /* e_shoff */
        0, /* e_flags */
        (Elf64_Half)sizeof(Elf64_Ehdr), /* eh_size */
        0, /* e_phentsize */
        0, /* e_phnum */
        (Elf64_Half)sizeof(Elf64_Shdr), /* e_shentsize */
        5, /* e_shnum */
        2 /* e_shstrndx */
    };

    /* 64-bit Elf section header table */
    static Elf64_Shdr sectionHeaders64[5]={
        { /* SHN_UNDEF */
            0, 0, 0, 0, 0, 0, 0, 0, 0, 0
        },
        { /* .symtab */
            1, /* sh_name */
            SHT_SYMTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf64_Off)(sizeof(header64)+sizeof(sectionHeaders64)), /* sh_offset */
            (Elf64_Xword)(2*sizeof(Elf64_Sym)), /* sh_size */
            3, /* sh_link=sect hdr index of .strtab */
            1, /* sh_info=One greater than the symbol table index of the last
                * local symbol (with STB_LOCAL). */
            4, /* sh_addralign */
            (Elf64_Xword)(sizeof(Elf64_Sym)) /* sh_entsize */
        },
        { /* .shstrtab */
            9, /* sh_name */
            SHT_STRTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf64_Off)(sizeof(header64)+sizeof(sectionHeaders64)+2*sizeof(Elf64_Sym)), /* sh_offset */
            40, /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            1, /* sh_addralign */
            0 /* sh_entsize */
        },
        { /* .strtab */
            19, /* sh_name */
            SHT_STRTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf64_Off)(sizeof(header64)+sizeof(sectionHeaders64)+2*sizeof(Elf64_Sym)+40), /* sh_offset */
            (Elf64_Xword)sizeof(entry), /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            1, /* sh_addralign */
            0 /* sh_entsize */
        },
        { /* .rodata */
            27, /* sh_name */
            SHT_PROGBITS,
            SHF_ALLOC, /* sh_flags */
            0, /* sh_addr */
            (Elf64_Off)(sizeof(header64)+sizeof(sectionHeaders64)+2*sizeof(Elf64_Sym)+40+sizeof(entry)), /* sh_offset */
            0, /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            16, /* sh_addralign */
            0 /* sh_entsize */
        }
    };

    /*
     * 64-bit symbol table
     * careful: different order of items compared with Elf32_sym!
     */
    static Elf64_Sym symbols64[2]={
        { /* STN_UNDEF */
            0, 0, 0, 0, 0, 0
        },
        { /* data entry point */
            1, /* st_name */
            ELF64_ST_INFO(STB_GLOBAL, STT_OBJECT),
            0, /* st_other */
            4, /* st_shndx=index of related section table entry */
            0, /* st_value */
            0 /* st_size */
        }
    };

#endif /* U_ELF64 */

    /* entry[] have a leading NUL */
    entryOffset=1;

    /* in the common code, count entryLength from after the NUL */
    entryLengthOffset=1;

    newSuffix=".o";

#elif U_PLATFORM_HAS_WIN32_API
    struct {
        IMAGE_FILE_HEADER fileHeader;
        IMAGE_SECTION_HEADER sections[2];
        char linkerOptions[100];
    } objHeader;
    IMAGE_SYMBOL symbols[1];
    struct {
        DWORD sizeofLongNames;
        char longNames[100];
    } symbolNames;

    /*
     * entry sometimes have a leading '_'
     * overwritten if entryOffset==0 depending on the target platform
     * see check for cpu below
     */
    entry[0]='_';

    newSuffix=".obj";
#else
#   error "Unknown platform for CAN_GENERATE_OBJECTS."
#endif

    /* deal with options, files and the entry point name */
    getArchitecture(&cpu, &bits, &makeBigEndian, optMatchArch);
    if (optMatchArch)
    {
        printf("genccode: --match-arch cpu=%hu bits=%hu big-endian=%d\n", cpu, bits, makeBigEndian);
    }
    else
    {
        printf("genccode: using architecture cpu=%hu bits=%hu big-endian=%d\n", cpu, bits, makeBigEndian);
    }
#if U_PLATFORM_HAS_WIN32_API
    if(cpu==IMAGE_FILE_MACHINE_I386) {
        entryOffset=1;
    }
#endif

    in=T_FileStream_open(filename, "rb");
    if(in==NULL) {
        fprintf(stderr, "genccode: unable to open input file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }
    size=T_FileStream_size(in);

    getOutFilename(filename, destdir, buffer, entry+entryOffset, newSuffix, optFilename);
    if (outFilePath != NULL) {
        uprv_strcpy(outFilePath, buffer);
    }

    if(optEntryPoint != NULL) {
        uprv_strcpy(entry+entryOffset, optEntryPoint);
        uprv_strcat(entry+entryOffset, "_dat");
    }
    /* turn dashes in the entry name into underscores */
    entryLength=(int32_t)uprv_strlen(entry+entryLengthOffset);
    for(i=0; i<entryLength; ++i) {
        if(entry[entryLengthOffset+i]=='-') {
            entry[entryLengthOffset+i]='_';
        }
    }

    /* open the output file */
    out=T_FileStream_open(buffer, "wb");
    if(out==NULL) {
        fprintf(stderr, "genccode: unable to open output file %s\n", buffer);
        exit(U_FILE_ACCESS_ERROR);
    }

#ifdef U_ELF
    if(bits==32) {
        header32.e_ident[EI_DATA]= makeBigEndian ? ELFDATA2MSB : ELFDATA2LSB;
        header32.e_machine=cpu;

        /* 16-align .rodata in the .o file, just in case */
        paddingSize=sectionHeaders32[4].sh_offset & 0xf;
        if(paddingSize!=0) {
                paddingSize=0x10-paddingSize;
                sectionHeaders32[4].sh_offset+=paddingSize;
        }

        sectionHeaders32[4].sh_size=(Elf32_Word)size;

        symbols32[1].st_size=(Elf32_Word)size;

        /* write .o headers */
        T_FileStream_write(out, &header32, (int32_t)sizeof(header32));
        T_FileStream_write(out, sectionHeaders32, (int32_t)sizeof(sectionHeaders32));
        T_FileStream_write(out, symbols32, (int32_t)sizeof(symbols32));
    } else /* bits==64 */ {
#ifdef U_ELF64
        header64.e_ident[EI_DATA]= makeBigEndian ? ELFDATA2MSB : ELFDATA2LSB;
        header64.e_machine=cpu;

        /* 16-align .rodata in the .o file, just in case */
        paddingSize=sectionHeaders64[4].sh_offset & 0xf;
        if(paddingSize!=0) {
                paddingSize=0x10-paddingSize;
                sectionHeaders64[4].sh_offset+=paddingSize;
        }

        sectionHeaders64[4].sh_size=(Elf64_Xword)size;

        symbols64[1].st_size=(Elf64_Xword)size;

        /* write .o headers */
        T_FileStream_write(out, &header64, (int32_t)sizeof(header64));
        T_FileStream_write(out, sectionHeaders64, (int32_t)sizeof(sectionHeaders64));
        T_FileStream_write(out, symbols64, (int32_t)sizeof(symbols64));
#endif
    }

    T_FileStream_write(out, sectionStrings, (int32_t)sizeof(sectionStrings));
    T_FileStream_write(out, entry, (int32_t)sizeof(entry));
    if(paddingSize!=0) {
        T_FileStream_write(out, padding, paddingSize);
    }
#elif U_PLATFORM_HAS_WIN32_API
    /* populate the .obj headers */
    uprv_memset(&objHeader, 0, sizeof(objHeader));
    uprv_memset(&symbols, 0, sizeof(symbols));
    uprv_memset(&symbolNames, 0, sizeof(symbolNames));

    /* write the linker export directive */
    uprv_strcpy(objHeader.linkerOptions, "-export:");
    length=8;
    uprv_strcpy(objHeader.linkerOptions+length, entry);
    length+=entryLength;
    uprv_strcpy(objHeader.linkerOptions+length, ",data ");
    length+=6;

    /* set the file header */
    objHeader.fileHeader.Machine=cpu;
    objHeader.fileHeader.NumberOfSections=2;
    objHeader.fileHeader.TimeDateStamp=(DWORD)time(NULL);
    objHeader.fileHeader.PointerToSymbolTable=IMAGE_SIZEOF_FILE_HEADER+2*IMAGE_SIZEOF_SECTION_HEADER+length+size; /* start of symbol table */
    objHeader.fileHeader.NumberOfSymbols=1;

    /* set the section for the linker options */
    uprv_strncpy((char *)objHeader.sections[0].Name, ".drectve", 8);
    objHeader.sections[0].SizeOfRawData=length;
    objHeader.sections[0].PointerToRawData=IMAGE_SIZEOF_FILE_HEADER+2*IMAGE_SIZEOF_SECTION_HEADER;
    objHeader.sections[0].Characteristics=IMAGE_SCN_LNK_INFO|IMAGE_SCN_LNK_REMOVE|IMAGE_SCN_ALIGN_1BYTES;

    /* set the data section */
    uprv_strncpy((char *)objHeader.sections[1].Name, ".rdata", 6);
    objHeader.sections[1].SizeOfRawData=size;
    objHeader.sections[1].PointerToRawData=IMAGE_SIZEOF_FILE_HEADER+2*IMAGE_SIZEOF_SECTION_HEADER+length;
    objHeader.sections[1].Characteristics=IMAGE_SCN_CNT_INITIALIZED_DATA|IMAGE_SCN_ALIGN_16BYTES|IMAGE_SCN_MEM_READ;

    /* set the symbol table */
    if(entryLength<=8) {
        uprv_strncpy((char *)symbols[0].N.ShortName, entry, entryLength);
        symbolNames.sizeofLongNames=4;
    } else {
        symbols[0].N.Name.Short=0;
        symbols[0].N.Name.Long=4;
        symbolNames.sizeofLongNames=4+entryLength+1;
        uprv_strcpy(symbolNames.longNames, entry);
    }
    symbols[0].SectionNumber=2;
    symbols[0].StorageClass=IMAGE_SYM_CLASS_EXTERNAL;

    /* write the file header and the linker options section */
    T_FileStream_write(out, &objHeader, objHeader.sections[1].PointerToRawData);
#else
#   error "Unknown platform for CAN_GENERATE_OBJECTS."
#endif

    /* copy the data file into section 2 */
    for(;;) {
        length=T_FileStream_read(in, buffer, sizeof(buffer));
        if(length==0) {
            break;
        }
        T_FileStream_write(out, buffer, (int32_t)length);
    }

#if U_PLATFORM_HAS_WIN32_API
    /* write the symbol table */
    T_FileStream_write(out, symbols, IMAGE_SIZEOF_SYMBOL);
    T_FileStream_write(out, &symbolNames, symbolNames.sizeofLongNames);
#endif

    if(T_FileStream_error(in)) {
        fprintf(stderr, "genccode: file read error while generating from file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    if(T_FileStream_error(out)) {
        fprintf(stderr, "genccode: file write error while generating from file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    T_FileStream_close(out);
    T_FileStream_close(in);
}